

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O1

bool __thiscall luna::Table::EraseArrayValue(Table *this,size_t index)

{
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  pointer pVVar2;
  pointer *ppVVar3;
  bool bVar4;
  ulong uVar5;
  pointer __src;
  
  if (index != 0) {
    pvVar1 = (this->array_)._M_t.
             super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
             ._M_head_impl;
    if (pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (long)*(pointer *)
                     ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)
                             ._M_impl + 8) -
              *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl >> 4;
    }
    if (uVar5 < index) {
      bVar4 = false;
    }
    else {
      __src = (pointer)(index * 0x10 +
                       *(long *)&(pvVar1->
                                 super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                                 _M_impl);
      pVVar2 = *(pointer *)
                ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl + 8);
      if (__src != pVVar2) {
        memmove(__src + -1,__src,(long)pVVar2 - (long)__src);
      }
      ppVVar3 = (pointer *)
                ((long)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                        _M_impl + 8);
      *ppVVar3 = *ppVVar3 + -1;
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool Table::EraseArrayValue(std::size_t index)
    {
        if (index < 1 || index > ArraySize())
            return false;

        auto it = array_->begin();
        std::advance(it, index - 1);
        array_->erase(it);
        return true;
    }